

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

void __thiscall kj::(anonymous_namespace)::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  anon_unknown_0::AsyncStreamFd::whenWriteDisconnected((AsyncStreamFd *)this);
  return;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_SOME(p, writeDisconnectedPromise) {
      return p.addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }